

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O0

char * parseFilename(char *id,char *param_2)

{
  FILE *__stream;
  UBool UVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *ext;
  UErrorCode status;
  int canonLen;
  char *canon;
  int canonCapacity;
  int pos;
  char *localeID;
  char *pcStack_18;
  int idLen;
  char *param_1_local;
  char *id_local;
  
  pcStack_18 = param_2;
  param_1_local = id;
  sVar2 = strlen(id);
  localeID._4_4_ = (int)sVar2;
  _canonCapacity = (char *)uprv_malloc_63((long)localeID._4_4_);
  canon._4_4_ = 0;
  canon._0_4_ = 0;
  _status = (char *)0x0;
  ext._4_4_ = 0;
  ext._0_4_ = U_ZERO_ERROR;
  pcVar3 = strchr(param_1_local,0x2e);
  if (pcVar3 == (char *)0x0) {
    canon._4_4_ = localeID._4_4_;
  }
  else {
    canon._4_4_ = (int)pcVar3 - (int)param_1_local;
  }
  memcpy(_canonCapacity,param_1_local,(long)canon._4_4_);
  _canonCapacity[canon._4_4_] = '\0';
  canon._0_4_ = canon._4_4_ * 3;
  _status = (char *)uprv_malloc_63((long)(int)canon);
  ext._4_4_ = uloc_canonicalize_63(_canonCapacity,_status,(int)canon,(UErrorCode *)&ext);
  UVar1 = U_FAILURE((UErrorCode)ext);
  pcVar3 = _canonCapacity;
  __stream = _stderr;
  if (UVar1 != '\0') {
    pcVar4 = u_errorName_63((UErrorCode)ext);
    fprintf(__stream,"Could not canonicalize the locale ID: %s. Error: %s\n",pcVar3,pcVar4);
    exit((UErrorCode)ext);
  }
  strnrepchr(_status,ext._4_4_,'_','-');
  return _status;
}

Assistant:

static char* parseFilename(const char* id, char* /*lang*/) {
    int idLen = (int) uprv_strlen(id);
    char* localeID = (char*) uprv_malloc(idLen);
    int pos = 0;
    int canonCapacity = 0;
    char* canon = NULL;
    int canonLen = 0;
    /*int i;*/
    UErrorCode status = U_ZERO_ERROR;
    const char *ext = uprv_strchr(id, '.');

    if(ext != NULL){
        pos = (int) (ext - id);
    } else {
        pos = idLen;
    }
    uprv_memcpy(localeID, id, pos);
    localeID[pos]=0; /* NUL terminate the string */

    canonCapacity =pos*3;
    canon = (char*) uprv_malloc(canonCapacity);
    canonLen = uloc_canonicalize(localeID, canon, canonCapacity, &status);

    if(U_FAILURE(status)){
        fprintf(stderr, "Could not canonicalize the locale ID: %s. Error: %s\n", localeID, u_errorName(status));
        exit(status);
    }
    strnrepchr(canon, canonLen, '_', '-');
    return canon;
}